

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

size_t __thiscall QPDF::getObjectCount(QPDF *this)

{
  bool bVar1;
  pointer pMVar2;
  reference ppVar3;
  size_t sVar4;
  int local_24;
  undefined1 local_20 [8];
  QPDFObjGen local_18;
  QPDFObjGen og;
  QPDF *this_local;
  
  og = (QPDFObjGen)this;
  fixDanglingReferences(this,false);
  QPDFObjGen::QPDFObjGen(&local_18);
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar1 = std::
          map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
          ::empty(&pMVar2->obj_cache);
  if (!bVar1) {
    std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m);
    std::
    map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
    ::rbegin((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
              *)local_20);
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::operator*((reverse_iterator<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                          *)local_20);
    local_18 = ppVar3->first;
  }
  local_24 = QPDFObjGen::getObj(&local_18);
  sVar4 = toS<int>(&local_24);
  return sVar4;
}

Assistant:

size_t
QPDF::getObjectCount()
{
    // This method returns the next available indirect object number. makeIndirectObject uses it for
    // this purpose. After fixDanglingReferences is called, all objects in the xref table will also
    // be in obj_cache.
    fixDanglingReferences();
    QPDFObjGen og;
    if (!m->obj_cache.empty()) {
        og = (*(m->obj_cache.rbegin())).first;
    }
    return toS(og.getObj());
}